

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::at(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
     *this,key_type *key)

{
  mapped_type *pmVar1;
  type_error *__return_storage_ptr__;
  size_t sVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->m_type == object) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ::at((this->m_value).object,key);
    return pmVar1;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  if ((ulong)this->m_type < 9) {
    __s = (&PTR_anon_var_dwarf_43516_00142c80)[this->m_type];
  }
  else {
    __s = "number";
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar2);
  std::operator+(&local_60,"cannot use at() with ",&local_40);
  detail::type_error::create(__return_storage_ptr__,0x130,&local_60);
  __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
}

Assistant:

const_reference at(const typename object_t::key_type& key) const
    {
        // at only works for objects
        if (JSON_HEDLEY_LIKELY(is_object()))
        {
            JSON_TRY
            {
                return m_value.object->at(key);
            }
            JSON_CATCH (std::out_of_range&)
            {
                // create better exception explanation
                JSON_THROW(out_of_range::create(403, "key '" + key + "' not found"));
            }
        }